

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdentifierExpression.cpp
# Opt level: O0

IdentifierExpression * __thiscall
hdc::IdentifierExpression::getName_abi_cxx11_(IdentifierExpression *this)

{
  string *psVar1;
  long in_RSI;
  IdentifierExpression *this_local;
  
  psVar1 = Token::getLexem_abi_cxx11_((Token *)(in_RSI + 0x28));
  std::__cxx11::string::string((string *)this,(string *)psVar1);
  return this;
}

Assistant:

std::string IdentifierExpression::getName() {
    return name.getLexem();
}